

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestVarious.hpp
# Opt level: O2

void __thiscall Omega_take_drop_Test::TestBody(Omega_take_drop_Test *this)

{
  char *pcVar1;
  AssertHelper local_68;
  AssertHelper local_60;
  __type t2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertionResult gtest_ar_1;
  __type t1;
  
  t1.super__Tuple_impl<0UL,_int,_const_char_*,_int,_int,_double>.
  super__Tuple_impl<1UL,_const_char_*,_int,_int,_double>.super__Tuple_impl<2UL,_int,_int,_double>.
  super__Tuple_impl<3UL,_int,_double>.super__Tuple_impl<4UL,_double>.
  super__Head_base<4UL,_double,_false>._M_head_impl = (_Head_base<4UL,_double,_false>)10.5;
  t1.super__Tuple_impl<0UL,_int,_const_char_*,_int,_int,_double>.
  super__Tuple_impl<1UL,_const_char_*,_int,_int,_double>.super__Tuple_impl<2UL,_int,_int,_double>.
  super__Tuple_impl<3UL,_int,_double>._8_8_ = &DAT_800000009;
  t1.super__Tuple_impl<0UL,_int,_const_char_*,_int,_int,_double>.
  super__Tuple_impl<1UL,_const_char_*,_int,_int,_double>.super__Head_base<1UL,_const_char_*,_false>.
  _M_head_impl = "yuppi!";
  t1.super__Tuple_impl<0UL,_int,_const_char_*,_int,_int,_double>.super__Head_base<0UL,_int,_false>.
  _M_head_impl = 7;
  gtest_ar_1.success_ = false;
  gtest_ar_1._1_7_ = 0x40250000000000;
  gtest_ar_1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_800000009;
  testing::internal::
  CmpHelperEQ<std::tuple<int,char_const*,int,int,double>,std::tuple<int,char_const*,int,int,double>>
            ((internal *)&t2,"t1","std::make_tuple(7, \"yuppi!\", 8, 9, 10.5)",&t1,
             (tuple<int,_const_char_*,_int,_int,_double> *)&gtest_ar_1);
  if ((char)t2.super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
            super__Head_base<1UL,_int,_false>._M_head_impl == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/meox[P]omega/Test/TestVarious.hpp"
               ,0x4c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_50);
  t2.super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
  _M_head_impl = (_Head_base<1UL,_int,_false>)0x6;
  t2.super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl = 5;
  local_68.data_ = (AssertHelperData *)0x500000006;
  testing::internal::CmpHelperEQ<std::tuple<int,int>,std::tuple<int,int>>
            ((internal *)&gtest_ar_1,"t2","std::make_tuple(5, 6)",&t2,(tuple<int,_int> *)&local_68);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/meox[P]omega/Test/TestVarious.hpp"
               ,0x4f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  return;
}

Assistant:

TEST(Omega, take_drop)
{
    const auto t1 = omega::drop<2>(t);
    EXPECT_EQ (t1, std::make_tuple(7, "yuppi!", 8, 9, 10.5));

    const auto t2 = omega::take<2>(t);
    EXPECT_EQ (t2, std::make_tuple(5, 6));
}